

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O2

yy_state_type yy_get_previous_state(yyscan_t yyscanner)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  ulong uVar6;
  
  uVar1 = *(uint *)((long)yyscanner + 0x54);
  pbVar4 = *(byte **)((long)yyscanner + 0x88);
LAB_0047bec0:
  uVar2 = (ulong)uVar1;
  if (*(byte **)((long)yyscanner + 0x48) <= pbVar4) {
    return uVar1;
  }
  if ((ulong)*pbVar4 == 0) {
    bVar5 = 1;
  }
  else {
    bVar5 = ""[*pbVar4];
  }
  if ((0x6a582007UL >> (uVar2 & 0x3f) & 1) == 0) {
    *(uint *)((long)yyscanner + 0x70) = uVar1;
    *(byte **)((long)yyscanner + 0x78) = pbVar4;
  }
  do {
    do {
      uVar6 = (ulong)(int)uVar2;
      lVar3 = (long)yy_base[uVar6] + (ulong)bVar5;
      if ((int)uVar2 == (int)yy_chk[lVar3]) {
        uVar1 = (uint)yy_nxt[lVar3];
        pbVar4 = pbVar4 + 1;
        goto LAB_0047bec0;
      }
      uVar2 = (ulong)(uint)(int)yy_def[uVar6];
    } while ((0x21020UL >> (uVar6 & 0x3f) & 1) == 0);
    bVar5 = ""[bVar5];
  } while( true );
}

Assistant:

static yy_state_type yy_get_previous_state (yyscan_t yyscanner)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_current_state = yyg->yy_start;

	for ( yy_cp = yyg->yytext_ptr + YY_MORE_ADJ; yy_cp < yyg->yy_c_buf_p; ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			yyg->yy_last_accepting_state = yy_current_state;
			yyg->yy_last_accepting_cpos = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 30 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}